

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color.cpp
# Opt level: O3

string * __thiscall
pbrt::RGBToSpectrumTable::ToString_abi_cxx11_
          (string *__return_storage_ptr__,RGBToSpectrumTable *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *pcVar2;
  string id;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  paVar1 = &local_40.field_2;
  local_40._M_string_length = 0;
  local_40.field_2._M_local_buf[0] = '\0';
  local_40._M_dataplus._M_p = (pointer)paVar1;
  if (sRGB == this) {
    pcVar2 = "(sRGB) ";
  }
  else if (DCI_P3 == this) {
    pcVar2 = "(DCI_P3) ";
  }
  else if (Rec2020 == this) {
    pcVar2 = "(Rec2020) ";
  }
  else {
    if (ACES2065_1 != this) goto LAB_0029ac68;
    pcVar2 = "(ACES2065_1) ";
  }
  std::__cxx11::string::_M_replace((ulong)&local_40,0,(char *)0x0,(ulong)pcVar2);
LAB_0029ac68:
  if (local_40._M_string_length != 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    detail::stringPrintfRecursive<int_const&,std::__cxx11::string&>
              (__return_storage_ptr__,"[ RGBToSpectrumTable res: %d %s]",&this->res,&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != paVar1) {
      operator_delete(local_40._M_dataplus._M_p,
                      CONCAT71(local_40.field_2._M_allocated_capacity._1_7_,
                               local_40.field_2._M_local_buf[0]) + 1);
    }
    return __return_storage_ptr__;
  }
  LogFatal<char_const(&)[12]>
            (Fatal,
             "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/color.cpp"
             ,0xc3,"Check failed: %s",(char (*) [12])"!id.empty()");
}

Assistant:

std::string RGBToSpectrumTable::ToString() const {
    std::string id;
    if (this == RGBToSpectrumTable::sRGB)
        id = "(sRGB) ";
    else if (this == RGBToSpectrumTable::DCI_P3)
        id = "(DCI_P3) ";
    else if (this == RGBToSpectrumTable::Rec2020)
        id = "(Rec2020) ";
    else if (this == RGBToSpectrumTable::ACES2065_1)
        id = "(ACES2065_1) ";
    CHECK(!id.empty());

    return StringPrintf("[ RGBToSpectrumTable res: %d %s]", res, id);
}